

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_env_cell_loc1(sexp env,sexp key,int localp,sexp_conflict *varenv)

{
  sexp psVar1;
  sexp psVar2;
  
  do {
    for (psVar1 = (env->value).type.getters;
        (psVar2 = env, ((ulong)psVar1 & 3) == 0 && (psVar1->tag == 6));
        psVar1 = (psVar1->value).type.slots) {
      if ((psVar1->value).type.name == key) {
        if (varenv != (sexp_conflict *)0x0) {
          *varenv = env;
        }
        return (psVar1->value).type.cpl;
      }
    }
    while ((psVar2 = (psVar2->value).type.slots, ((ulong)psVar2 & 3) == 0 && (psVar2->tag == 6))) {
      if ((psVar2->value).type.name == key) {
        if (varenv != (sexp_conflict *)0x0) {
          *varenv = env;
        }
        return psVar2;
      }
    }
  } while ((((localp == 0) && (env = (env->value).type.name, env != (sexp)0x0)) &&
           (((ulong)env & 3) == 0)) && (env->tag == 0x17));
  return (sexp)0x0;
}

Assistant:

static sexp sexp_env_cell_loc1 (sexp env, sexp key, int localp, sexp *varenv) {
  sexp ls;
  do {
#if SEXP_USE_RENAME_BINDINGS
    for (ls=sexp_env_renames(env); sexp_pairp(ls); ls=sexp_env_next_cell(ls))
      if (sexp_car(ls) == key) {
        if (varenv) *varenv = env;
        return sexp_cdr(ls);
      }
#endif
    for (ls=sexp_env_bindings(env); sexp_pairp(ls); ls=sexp_env_next_cell(ls))
      if (sexp_car(ls) == key) {
        if (varenv) *varenv = env;
        return ls;
      }
    if (localp) break;
    env = sexp_env_parent(env);
  } while (env && sexp_envp(env));
  return NULL;
}